

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall
cimg_library::CImg<char>::_load_raw
          (CImg<char> *this,FILE *file,char *filename,uint size_x,uint size_y,uint size_z,
          uint size_c,bool is_multiplexed,bool invert_endianness,ulongT offset)

{
  bool bVar1;
  FILE *__stream;
  long __off;
  CImgArgumentException *this_00;
  int z;
  uint size_c_00;
  uint z_00;
  char *pcVar2;
  char *pcVar3;
  int y;
  uint y_00;
  size_t nmemb;
  int x;
  uint x_00;
  uint local_60;
  uint local_5c;
  CImg<char> buf;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"char");
  }
  else {
    bVar1 = cimg::is_directory(filename);
    if (!bVar1) {
      nmemb = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
      __stream = (FILE *)file;
      if (file == (FILE *)0x0) {
        __stream = cimg::fopen(filename,"rb");
      }
      size_c_00 = size_c;
      local_60 = size_z;
      local_5c = size_x;
      if (nmemb == 0) {
        __off = ftell(__stream);
        if (__off < 0) {
          this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
          pcVar2 = "non-";
          if (this->_is_shared != false) {
            pcVar2 = "";
          }
          pcVar3 = "(FILE*)";
          if (filename != (char *)0x0) {
            pcVar3 = filename;
          }
          CImgArgumentException::CImgArgumentException
                    (this_00,
                     "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Cannot determine size of input file \'%s\'."
                     ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                     (ulong)this->_spectrum,this->_data,pcVar2,"char",pcVar3);
          goto LAB_001afbd8;
        }
        size_c_00 = 1;
        fseek(__stream,0,2);
        nmemb = ftell(__stream);
        fseek(__stream,__off,0);
        size_y = (uint)nmemb;
        local_60 = 1;
        local_5c = 1;
      }
      fseek(__stream,offset,0);
      buf._width._0_1_ = 0;
      assign(this,local_5c,size_y,local_60,size_c_00,(char *)&buf);
      if ((is_multiplexed && size_c != 1) || (nmemb == 0)) {
        if (nmemb != 0) {
          CImg(&buf,1,1,1,size_c_00);
          for (z_00 = 0; (int)z_00 < (int)this->_depth; z_00 = z_00 + 1) {
            for (y_00 = 0; (int)y_00 < (int)this->_height; y_00 = y_00 + 1) {
              for (x_00 = 0; (int)x_00 < (int)this->_width; x_00 = x_00 + 1) {
                cimg::fread<char>(buf._data,(ulong)size_c_00,(FILE *)__stream);
                set_vector_at<char>(this,&buf,x_00,y_00,z_00);
              }
            }
          }
          ~CImg(&buf);
        }
      }
      else {
        cimg::fread<char>(this->_data,nmemb,(FILE *)__stream);
      }
      if (file == (FILE *)0x0) {
        cimg::fclose(__stream);
      }
      return this;
    }
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar2 = "non-";
    if (this->_is_shared != false) {
      pcVar2 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename \'%s\' is a directory."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"char",filename);
  }
LAB_001afbd8:
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_raw(std::FILE *const file, const char *const filename,
		       const unsigned int size_x, const unsigned int size_y,
		       const unsigned int size_z, const unsigned int size_c,
		       const bool is_multiplexed, const bool invert_endianness,
                       const ulongT offset) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename is (null).",
                                    cimg_instance);
      if (cimg::is_directory(filename))
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename '%s' is a directory.",
                                    cimg_instance,filename);

      ulongT siz = (ulongT)size_x*size_y*size_z*size_c;
      unsigned int
        _size_x = size_x,
        _size_y = size_y,
        _size_z = size_z,
        _size_c = size_c;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      if (!siz) {  // Retrieve file size
        const longT fpos = cimg::ftell(nfile);
        if (fpos<0) throw CImgArgumentException(_cimg_instance
                                                "load_raw(): Cannot determine size of input file '%s'.",
                                                cimg_instance,filename?filename:"(FILE*)");
        cimg::fseek(nfile,0,SEEK_END);
        siz = cimg::ftell(nfile)/sizeof(T);
		_size_y = (unsigned int)siz;
        _size_x = _size_z = _size_c = 1;
        cimg::fseek(nfile,fpos,SEEK_SET);
      }
      cimg::fseek(nfile,offset,SEEK_SET);
      assign(_size_x,_size_y,_size_z,_size_c,0);
      if (siz && (!is_multiplexed || size_c==1)) {
        cimg::fread(_data,siz,nfile);
        if (invert_endianness) cimg::invert_endianness(_data,siz);
      } else if (siz) {
        CImg<T> buf(1,1,1,_size_c);
        cimg_forXYZ(*this,x,y,z) {
          cimg::fread(buf._data,_size_c,nfile);
          if (invert_endianness) cimg::invert_endianness(buf._data,_size_c);
          set_vector_at(buf,x,y,z);
        }
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }